

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

UntypedActionResultHolderBase * __thiscall
testing::internal::FunctionMocker<void_(solitaire::piles::PileId,_unsigned_int)>::
UntypedPerformAction
          (FunctionMocker<void_(solitaire::piles::PileId,_unsigned_int)> *this,void *untyped_action,
          void *untyped_args)

{
  UntypedActionResultHolderBase *pUVar1;
  ArgumentTuple *args;
  Action<void_(solitaire::piles::PileId,_unsigned_int)> action;
  void *untyped_args_local;
  void *untyped_action_local;
  FunctionMocker<void_(solitaire::piles::PileId,_unsigned_int)> *this_local;
  
  action.fun_._M_invoker = (_Invoker_type)untyped_args;
  Action<void_(solitaire::piles::PileId,_unsigned_int)>::Action
            ((Action<void_(solitaire::piles::PileId,_unsigned_int)> *)&args,
             (Action<void_(solitaire::piles::PileId,_unsigned_int)> *)untyped_action);
  pUVar1 = &ActionResultHolder<void>::PerformAction<void(solitaire::piles::PileId,unsigned_int)>
                      ((Action<void_(solitaire::piles::PileId,_unsigned_int)> *)&args,
                       (ArgumentTuple *)action.fun_._M_invoker)->super_UntypedActionResultHolderBase
  ;
  Action<void_(solitaire::piles::PileId,_unsigned_int)>::~Action
            ((Action<void_(solitaire::piles::PileId,_unsigned_int)> *)&args);
  return pUVar1;
}

Assistant:

UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, void* untyped_args) const override {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    ArgumentTuple* args = static_cast<ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, std::move(*args));
  }